

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall
QDockAreaLayout::paintSeparators
          (QDockAreaLayout *this,QPainter *p,QWidget *widget,QRegion *clip,QPoint *mouse)

{
  Orientation OVar1;
  bool bVar2;
  char cVar3;
  int i;
  long lVar4;
  long lVar5;
  ulong uVar6;
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  do {
    this_00 = this->docks + lVar4;
    uVar6 = 0xffffffffffffffff;
    lVar5 = 0;
    do {
      uVar6 = uVar6 + 1;
      if ((ulong)(this_00->item_list).d.size <= uVar6) goto LAB_004009d6;
      bVar2 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&((this_00->item_list).d.ptr)->widgetItem + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (bVar2);
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (undefined1  [16])separatorRect(this,(int)lVar4);
    cVar3 = QRegion::contains((QRect *)clip);
    if (cVar3 != '\0') {
      bVar2 = QDockAreaLayoutInfo::hasFixedSize(this_00);
      if (!bVar2) {
        OVar1 = this_00->o;
        bVar2 = (bool)QRect::contains((QPoint *)local_48,SUB81(mouse,0));
        paintSep(p,widget,(QRect *)local_48,(OVar1 == Horizontal) + Horizontal,bVar2);
      }
    }
    cVar3 = QRegion::contains((QRect *)clip);
    if (cVar3 != '\0') {
      QDockAreaLayoutInfo::paintSeparators(this_00,p,widget,clip,mouse);
    }
LAB_004009d6:
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void QDockAreaLayout::paintSeparators(QPainter *p, QWidget *widget,
                                                const QRegion &clip,
                                                const QPoint &mouse) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;
        QRect r = separatorRect(i);
        if (clip.contains(r) && !dock.hasFixedSize()) {
            Qt::Orientation opposite = dock.o == Qt::Horizontal
                                        ? Qt::Vertical : Qt::Horizontal;
            paintSep(p, widget, r, opposite, r.contains(mouse));
        }
        if (clip.contains(dock.rect))
            dock.paintSeparators(p, widget, clip, mouse);
    }
}